

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::BindingImageInvalidTest::prepareNextTestCase
          (BindingImageInvalidTest *this,GLuint test_case_index)

{
  GLuint test_case_index_local;
  BindingImageInvalidTest *this_local;
  
  if (test_case_index == 0xffffffff) {
    this->m_case = TEST_CASES_MAX;
  }
  else {
    if (3 < test_case_index) {
      return false;
    }
    this->m_case = test_case_index;
  }
  return true;
}

Assistant:

bool BindingImageInvalidTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	switch (test_case_index)
	{
	case (glw::GLuint)-1:
		m_case = TEST_CASES_MAX;
		break;
	case NEGATIVE_VALUE:
	case VARIABLE_NAME:
	case STD140:
	case MISSING:
		m_case = (TESTCASES)test_case_index;
		break;
	default:
		return false;
	}

	return true;
}